

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

void * delete(hash_table_t *h,uint32 hash,char *key,size_t len)

{
  hash_entry_s *ptr;
  int32 iVar1;
  bool bVar2;
  void *val;
  hash_entry_t *prev;
  hash_entry_t *entry;
  size_t len_local;
  char *key_local;
  uint32 hash_local;
  hash_table_t *h_local;
  
  val = (void *)0x0;
  prev = h->table + hash;
  if (prev->key == (char *)0x0) {
    h_local = (hash_table_t *)0x0;
  }
  else {
    if (h->nocase == 0) {
      while( true ) {
        bVar2 = false;
        if ((prev != (hash_entry_t *)0x0) && (bVar2 = true, prev->len == len)) {
          iVar1 = keycmp_case(prev,key);
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        val = prev;
        prev = prev->next;
      }
    }
    else {
      while( true ) {
        bVar2 = false;
        if ((prev != (hash_entry_t *)0x0) && (bVar2 = true, prev->len == len)) {
          iVar1 = keycmp_nocase(prev,key);
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        val = prev;
        prev = prev->next;
      }
    }
    if (prev == (hash_entry_t *)0x0) {
      h_local = (hash_table_t *)0x0;
    }
    else {
      h_local = (hash_table_t *)prev->val;
      if (val == (void *)0x0) {
        if (prev->next == (hash_entry_s *)0x0) {
          prev->key = (char *)0x0;
          prev->len = 0;
          prev->next = (hash_entry_s *)0x0;
        }
        else {
          ptr = prev->next;
          prev->key = ptr->key;
          prev->len = ptr->len;
          prev->val = ptr->val;
          prev->next = ptr->next;
          ckd_free(ptr);
        }
      }
      else {
        *(hash_entry_s **)((long)val + 0x18) = prev->next;
        ckd_free(prev);
      }
      h->inuse = h->inuse + -1;
    }
  }
  return h_local;
}

Assistant:

static void *
delete(hash_table_t * h, uint32 hash, const char *key, size_t len)
{
    hash_entry_t *entry, *prev;
    void *val;

    prev = NULL;
    entry = &(h->table[hash]);
    if (entry->key == NULL)
        return NULL;

    if (h->nocase) {
        while (entry && ((entry->len != len)
                         || (keycmp_nocase(entry, key) != 0))) {
            prev = entry;
            entry = entry->next;
        }
    }
    else {
        while (entry && ((entry->len != len)
                         || (keycmp_case(entry, key) != 0))) {
            prev = entry;
            entry = entry->next;
        }
    }

    if (entry == NULL)
        return NULL;

    /* At this point, entry will be the one required to be deleted, prev
       will contain the previous entry
     */
    val = entry->val;

    if (prev == NULL) {
        /* That is to say the entry in the hash table (not the chain) matched the key. */
        /* We will then copy the things from the next entry to the hash table */
        prev = entry;
        if (entry->next) {      /* There is a next entry, great, copy it. */
            entry = entry->next;
            prev->key = entry->key;
            prev->len = entry->len;
            prev->val = entry->val;
            prev->next = entry->next;
            ckd_free(entry);
        }
        else {                  /* There is not a next entry, just set the key to null */
            prev->key = NULL;
            prev->len = 0;
            prev->next = NULL;
        }

    }
    else {                      /* This case is simple */
        prev->next = entry->next;
        ckd_free(entry);
    }

    /* Do wiring and free the entry */

    --h->inuse;

    return val;
}